

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  CacheEntryType CVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::reg == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::reg), iVar5 != 0)) {
    ParseCacheEntry::reg.regmust = (char *)0x0;
    ParseCacheEntry::reg.program = (char *)0x0;
    ParseCacheEntry::reg.progsize = 0;
    memset(&ParseCacheEntry::reg,0,0x20a);
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::regQuoted), iVar5 != 0)) {
    ParseCacheEntry::regQuoted.regmust = (char *)0x0;
    ParseCacheEntry::regQuoted.program = (char *)0x0;
    ParseCacheEntry::regQuoted.progsize = 0;
    memset(&ParseCacheEntry::regQuoted,0,0x20a);
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::regQuoted);
  }
  bVar3 = cmsys::RegularExpression::find
                    (&ParseCacheEntry::regQuoted,(entry->_M_dataplus)._M_p,
                     &ParseCacheEntry::regQuoted.regmatch);
  if (bVar3) {
    if (ParseCacheEntry::regQuoted.regmatch.startp[1] == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseCacheEntry::regQuoted.regmatch.startp[1],
                 ParseCacheEntry::regQuoted.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    local_50 = &local_40;
    if (ParseCacheEntry::regQuoted.regmatch.startp[2] == (char *)0x0) {
      local_48 = 0;
      local_40 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseCacheEntry::regQuoted.regmatch.startp[2],
                 ParseCacheEntry::regQuoted.regmatch.endp[2]);
    }
    pbVar6 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (&cmCacheEntryTypes_abi_cxx11_,
                        &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,&local_50)
    ;
    CVar4 = STRING;
    if (pbVar6 != &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_) {
      CVar4 = (CacheEntryType)((ulong)((long)&pbVar6[-0x51517].field_2 + 8) >> 5);
    }
    *type = CVar4;
    pcVar1 = ParseCacheEntry::regQuoted.regmatch.startp[3];
    pcVar2 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      pcVar1 = ParseCacheEntry::regQuoted.regmatch.startp[3];
      pcVar2 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    }
joined_r0x001a95cc:
    if (pcVar1 == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar1,pcVar2);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 == &local_40) goto LAB_001a961c;
  }
  else {
    bVar3 = cmsys::RegularExpression::find
                      (&ParseCacheEntry::reg,(entry->_M_dataplus)._M_p,
                       &ParseCacheEntry::reg.regmatch);
    if (bVar3) {
      if (ParseCacheEntry::reg.regmatch.startp[1] == (char *)0x0) {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseCacheEntry::reg.regmatch.startp[1],
                   ParseCacheEntry::reg.regmatch.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      local_50 = &local_40;
      if (ParseCacheEntry::reg.regmatch.startp[2] == (char *)0x0) {
        local_48 = 0;
        local_40 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseCacheEntry::reg.regmatch.startp[2],
                   ParseCacheEntry::reg.regmatch.endp[2]);
      }
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (&cmCacheEntryTypes_abi_cxx11_,
                          &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                          &local_50);
      CVar4 = STRING;
      if (pbVar6 != &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_) {
        CVar4 = (CacheEntryType)((ulong)((long)&pbVar6[-0x51517].field_2 + 8) >> 5);
      }
      *type = CVar4;
      pcVar1 = ParseCacheEntry::reg.regmatch.startp[3];
      pcVar2 = ParseCacheEntry::reg.regmatch.endp[3];
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        pcVar1 = ParseCacheEntry::reg.regmatch.startp[3];
        pcVar2 = ParseCacheEntry::reg.regmatch.endp[3];
      }
      goto joined_r0x001a95cc;
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::reg == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::reg), iVar5 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._528_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._544_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._552_4_ = 0;
      memset(ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
             ::reg,0,0x20a);
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::reg);
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::regQuoted == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::regQuoted), iVar5 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._528_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._544_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._552_4_ = 0;
      memset(ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
             ::regQuoted,0,0x20a);
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::regQuoted);
    }
    bVar3 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted,(entry->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted);
    if (bVar3) {
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._8_8_ == 0) {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._264_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._272_8_;
      uVar8 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._16_8_ != 0) goto LAB_001a972f;
LAB_001a973e:
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
    }
    else {
      bVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg,(entry->_M_dataplus)._M_p,
                         (RegularExpressionMatch *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
      if (!bVar3) {
        return false;
      }
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._8_8_ == 0) {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._264_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._272_8_;
      uVar8 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._16_8_ == 0) goto LAB_001a973e;
LAB_001a972f:
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,uVar8,uVar7);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 == &local_40) goto LAB_001a961c;
  }
  operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
LAB_001a961c:
  if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return true;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry, std::string& var,
                              std::string& value,
                              cmStateEnums::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if (regQuoted.find(entry)) {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2));
    value = regQuoted.match(3);
    flag = true;
  } else if (reg.find(entry)) {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2));
    value = reg.match(3);
    flag = true;
  }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag && value.size() >= 2 && value.front() == '\'' &&
      value.back() == '\'') {
    value = value.substr(1, value.size() - 2);
  }

  if (!flag) {
    return ParseEntryWithoutType(entry, var, value);
  }

  return flag;
}